

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

void __thiscall fasttext::Vector::addRow(Vector *this,Matrix *A,int64_t i,real a)

{
  ulong uVar1;
  real *prVar2;
  real *prVar3;
  undefined1 auVar4 [16];
  uint __line;
  ulong uVar5;
  char *__assertion;
  undefined1 in_register_00001204 [12];
  
  if (i < 0) {
    __assertion = "i >= 0";
    __line = 0x3a;
  }
  else if (i < A->m_) {
    uVar1 = this->m_;
    if (uVar1 == A->n_) {
      prVar2 = A->data_;
      prVar3 = this->data_;
      for (uVar5 = 0; (~((long)uVar1 >> 0x3f) & uVar1) != uVar5; uVar5 = uVar5 + 1) {
        auVar4._4_12_ = in_register_00001204;
        auVar4._0_4_ = a;
        auVar4 = vfmadd213ss_fma(ZEXT416((uint)prVar2[i * uVar1 + uVar5]),auVar4,
                                 ZEXT416((uint)prVar3[uVar5]));
        prVar3[uVar5] = auVar4._0_4_;
      }
      return;
    }
    __assertion = "m_ == A.n_";
    __line = 0x3c;
  }
  else {
    __assertion = "i < A.m_";
    __line = 0x3b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                ,__line,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
}

Assistant:

void Vector::addRow(const Matrix& A, int64_t i, real a) {
  assert(i >= 0);
  assert(i < A.m_);
  assert(m_ == A.n_);
  for (int64_t j = 0; j < A.n_; j++) {
    data_[j] += a * A.data_[i * A.n_ + j];
  }
}